

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O2

void basic_suite::test_null(void)

{
  undefined4 local_1dc;
  size_type local_1d8 [4];
  writer writer;
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&result);
  trial::protocol::json::basic_writer<char,16ul>::basic_writer<std::__cxx11::ostringstream>
            ((basic_writer<char,16ul> *)&writer,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&result);
  local_1d8[0] = trial::protocol::json::basic_writer<char,_16UL>::null_value(&writer);
  local_1dc = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value<token::null>()","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0x25,"void basic_suite::test_null()",local_1d8,&local_1dc);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[5]>
            ("result.str()","\"null\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0x26,"void basic_suite::test_null()",local_1d8,"null");
  std::__cxx11::string::~string((string *)local_1d8);
  trial::protocol::json::basic_writer<char,_16UL>::~basic_writer(&writer);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result);
  return;
}

Assistant:

void test_null()
{
    std::ostringstream result;
    json::writer writer(result);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value<token::null>(), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "null");
}